

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double tand(double angle)

{
  double in_XMM0_Qa;
  double dVar1;
  double resid;
  double local_8;
  
  dVar1 = fmod(in_XMM0_Qa,360.0);
  if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((ABS(dVar1) == 180.0 && (!NAN(ABS(dVar1)))))) {
    local_8 = 0.0;
  }
  else if (((dVar1 == 45.0) && (!NAN(dVar1))) || ((dVar1 == 225.0 && (!NAN(dVar1))))) {
    local_8 = 1.0;
  }
  else if (((dVar1 == -135.0) && (!NAN(dVar1))) || ((dVar1 == -315.0 && (!NAN(dVar1))))) {
    local_8 = -1.0;
  }
  else {
    local_8 = tan(in_XMM0_Qa * 0.017453292519943295);
  }
  return local_8;
}

Assistant:

double tand(double angle) {
    double resid;

    resid = fmod(angle, 360.0);
    if (resid == 0.0 || fabs(resid) == 180.0) {
        return 0.0;
    } else if (resid == 45.0 || resid == 225.0) {
        return 1.0;
    } else if (resid == -135.0 || resid == -315.0) {
        return -1.0;
    }

    return tan(angle * D2R);
}